

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O0

void print_poll_data(char *name,uint8_t *signals)

{
  long in_RSI;
  undefined8 in_RDI;
  int s;
  int i;
  uint local_18;
  int local_14;
  
  printf("Print data poll \'%s\':\n",in_RDI);
  for (local_18 = 0; (int)local_18 < 8; local_18 = local_18 + 1) {
    printf("Set %i:",(ulong)local_18);
    for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
      if (local_14 % 0x10 == 0) {
        printf("\n0x%02x: ",(long)local_14 % 0x100 & 0xffffffff);
      }
      printf("%.3i ",(ulong)*(byte *)(in_RSI + (int)(local_18 * 0x100 + local_14)));
      if ((local_14 != 0) && (local_14 % 0x100 == 0)) {
        printf("\n\n");
      }
    }
    if (local_18 != 7) {
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

void print_poll_data(const char *name, uint8_t *signals)
{
	int i, s;

	printf("Print data poll '%s':\n", name);
	for (s = 0; s < 8; s++) {
		printf("Set %i:", s);
		for (i = 0; i < 0x20 * 8; i++) {
			if (i % 0x10 == 0)
				printf("\n0x%02x: ", i % (0x20 * 8));

			printf("%.3i ", SIGNAL_VALUE(signals, s, i));

			if (i != 0 && i % (SIGNALS_LENGTH) == 0)
				printf("\n\n");
		}

		if (s != 7)
			printf("\n");
		printf("\n");
	}
}